

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testparse.c
# Opt level: O0

void print_symbols(MOJOSHADER_symbol *sym,uint symbol_count,uint indent)

{
  uint local_1c;
  int i;
  uint indent_local;
  uint symbol_count_local;
  MOJOSHADER_symbol *sym_local;
  
  if (indent != 0) {
    do_indent(indent);
  }
  printf("SYMBOLS:");
  if (symbol_count == 0) {
    printf(" (none.)\n");
  }
  else {
    printf("\n");
    _indent_local = sym;
    for (local_1c = 0; local_1c < symbol_count; local_1c = local_1c + 1) {
      if (indent != 0) {
        do_indent(indent);
      }
      printf("    * %d: \"%s\"\n",(ulong)local_1c,_indent_local->name);
      if (indent != 0) {
        do_indent(indent);
      }
      printf("      register set %s\n",print_symbols::regsets[_indent_local->register_set]);
      if (indent != 0) {
        do_indent(indent);
      }
      printf("      register index %u\n",(ulong)_indent_local->register_index);
      if (indent != 0) {
        do_indent(indent);
      }
      printf("      register count %u\n",(ulong)_indent_local->register_count);
      print_typeinfo(&_indent_local->info,indent);
      _indent_local = _indent_local + 1;
    }
    printf("\n");
  }
  return;
}

Assistant:

static void print_symbols(const MOJOSHADER_symbol *sym,
                          const unsigned int symbol_count,
                          const unsigned int indent)
{
    INDENT(); printf("SYMBOLS:");
    if (symbol_count == 0)
        printf(" (none.)\n");
    else
    {
        int i;
        printf("\n");
        for (i = 0; i < symbol_count; i++, sym++)
        {
            static const char *regsets[] = {
                "bool", "int4", "float4", "sampler"
            };

            INDENT(); printf("    * %d: \"%s\"\n", i, sym->name);
            INDENT(); printf("      register set %s\n", regsets[sym->register_set]);
            INDENT(); printf("      register index %u\n", sym->register_index);
            INDENT(); printf("      register count %u\n", sym->register_count);
            print_typeinfo(&sym->info, indent);
        } // for
        printf("\n");
    } // else
}